

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

bool __thiscall
ON_OBSOLETE_V5_DimOrdinate::Read(ON_OBSOLETE_V5_DimOrdinate *this,ON_BinaryArchive *file)

{
  bool bVar1;
  int local_2c;
  int local_28;
  int subminor_version;
  int submajor_version;
  int iStack_1c;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *file_local;
  ON_OBSOLETE_V5_DimOrdinate *this_local;
  
  iStack_1c = 0;
  submajor_version = 0;
  _minor_version = file;
  file_local = (ON_BinaryArchive *)this;
  subminor_version._3_1_ =
       ON_BinaryArchive::BeginRead3dmChunk
                 (file,0x40008000,&stack0xffffffffffffffe4,&submajor_version);
  if ((bool)subminor_version._3_1_) {
    if (iStack_1c == 1) {
      local_28 = 0;
      local_2c = 0;
      subminor_version._3_1_ =
           ON_BinaryArchive::BeginRead3dmChunk(_minor_version,0x40008000,&local_28,&local_2c);
      if ((bool)subminor_version._3_1_) {
        if (local_28 == 1) {
          bVar1 = ON_OBSOLETE_V5_Annotation::Read
                            (&this->super_ON_OBSOLETE_V5_Annotation,_minor_version);
          subminor_version._3_1_ = -bVar1 & 1;
        }
        else {
          subminor_version._3_1_ = 0;
        }
        bVar1 = ON_BinaryArchive::EndRead3dmChunk(_minor_version);
        if (!bVar1) {
          subminor_version._3_1_ = 0;
        }
      }
      if ((subminor_version._3_1_ & 1) != 0) {
        subminor_version._3_1_ =
             ON_BinaryArchive::ReadInt
                       (_minor_version,
                        (ON__INT32 *)&(this->super_ON_OBSOLETE_V5_Annotation).field_0xdc);
      }
      if (0 < submajor_version) {
        if ((subminor_version._3_1_ & 1) != 0) {
          subminor_version._3_1_ =
               ON_BinaryArchive::ReadDouble(_minor_version,&this->m_kink_offset_0);
        }
        if ((subminor_version._3_1_ & 1) != 0) {
          subminor_version._3_1_ =
               ON_BinaryArchive::ReadDouble(_minor_version,&this->m_kink_offset_1);
        }
      }
    }
    else {
      subminor_version._3_1_ = 0;
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(_minor_version);
    if (!bVar1) {
      subminor_version._3_1_ = 0;
    }
  }
  return (bool)(subminor_version._3_1_ & 1);
}

Assistant:

bool ON_OBSOLETE_V5_DimOrdinate::Read( ON_BinaryArchive& file )
{
  int major_version=0, minor_version=0;
  bool rc = file.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if (rc)
  {
    if ( 1 != major_version )
    {
      rc = false;
    }
    else
    {
      int submajor_version=0, subminor_version=0;

      // subchunk wraps ON_OBSOLETE_V5_Annotation field so this
      // function won't break if ON_OBSOLETE_V5_Annotation changes.
      rc = file.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&submajor_version,&subminor_version);
      if (rc)
      {
        if ( 1 != submajor_version )
          rc = false;
        else
        {
          rc = ON_OBSOLETE_V5_Annotation::Read( file) ? true : false;
        }
        if ( !file.EndRead3dmChunk() )
          rc = false;
      }

      if( rc) 
        rc = file.ReadInt( &m_direction);

      if( minor_version > 0)
      {
        if( rc) 
          rc = file.ReadDouble( &m_kink_offset_0);
        if( rc) 
          rc = file.ReadDouble( &m_kink_offset_1);
      }
    }

    if (!file.EndRead3dmChunk())
      rc = false;
  }
  return rc;
}